

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

uint fmt::v5::internal::
     parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
               (null_terminating_iterator<wchar_t> *it,
               specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
               *eh)

{
  wchar_t *pwVar1;
  uint uVar2;
  wchar_t *pwVar3;
  int iVar4;
  
  uVar2 = 0;
  pwVar1 = it->ptr_;
  do {
    pwVar3 = pwVar1 + 1;
    if (0xccccccc < uVar2) {
      it->ptr_ = pwVar1;
      uVar2 = 0x80000000;
      goto LAB_001251a2;
    }
    iVar4 = -0x30;
    if (pwVar1 != it->end_) {
      iVar4 = *pwVar1 + L'\xffffffd0';
    }
    uVar2 = uVar2 * 10 + iVar4;
  } while ((pwVar3 != it->end_) && (pwVar1 = pwVar3, (uint)(*pwVar3 + L'\xffffffd0') < 10));
  it->ptr_ = pwVar3;
  if ((int)uVar2 < 0) {
LAB_001251a2:
    specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
    ::on_error(&eh->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               ,"number is too big");
  }
  return uVar2;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(Iterator &it, ErrorHandler &&eh) {
  assert('0' <= *it && *it <= '9');
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*it - '0');
    // Workaround for MSVC "setup_exception stack overflow" error:
    auto next = it;
    ++next;
    it = next;
  } while ('0' <= *it && *it <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}